

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctaes.c
# Opt level: O1

void AES_encrypt(uchar *in,uchar *out,AES_KEY *key)

{
  int b;
  long lVar1;
  uchar *in_RCX;
  int iVar2;
  byte bVar3;
  int iVar4;
  uchar *puVar5;
  int b_2;
  AES_state s;
  AES_state local_48;
  
  local_48.slice[0] = 0;
  local_48.slice[1] = 0;
  local_48.slice[2] = 0;
  local_48.slice[3] = 0;
  local_48.slice[4] = 0;
  local_48.slice[5] = 0;
  local_48.slice[6] = 0;
  local_48.slice[7] = 0;
  LoadBytes(&local_48,in_RCX);
  lVar1 = 0;
  do {
    local_48.slice[lVar1] = local_48.slice[lVar1] ^ *(ushort *)(in + lVar1 * 2);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  if (1 < (int)out) {
    iVar4 = 1;
    puVar5 = in;
    do {
      in = puVar5 + 0x10;
      SubBytes(&local_48,0);
      ShiftRows(&local_48);
      MixColumns(&local_48,0);
      lVar1 = 0;
      do {
        local_48.slice[lVar1] = local_48.slice[lVar1] ^ *(ushort *)(puVar5 + lVar1 * 2 + 0x10);
        lVar1 = lVar1 + 1;
      } while (lVar1 != 8);
      iVar4 = iVar4 + 1;
      puVar5 = in;
    } while (iVar4 != (int)out);
  }
  lVar1 = 0;
  SubBytes(&local_48,0);
  ShiftRows(&local_48);
  do {
    local_48.slice[lVar1] = local_48.slice[lVar1] ^ *(ushort *)(in + lVar1 * 2 + 0x10);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  iVar4 = 0;
  do {
    iVar2 = 0;
    do {
      lVar1 = 0;
      bVar3 = 0;
      do {
        bVar3 = bVar3 | ((local_48.slice[lVar1] >> (iVar4 + iVar2 * 4 & 0x1fU) & 1) != 0) <<
                        ((byte)lVar1 & 0x1f);
        lVar1 = lVar1 + 1;
      } while (lVar1 != 8);
      *(byte *)key->rd_key = bVar3;
      key = (AES_KEY *)((long)key->rd_key + 1);
      iVar2 = iVar2 + 1;
    } while (iVar2 != 4);
    iVar4 = iVar4 + 1;
  } while (iVar4 != 4);
  return;
}

Assistant:

static void AES_encrypt(const AES_state* rounds, int nrounds, unsigned char* cipher16, const unsigned char* plain16) {
    AES_state s = {{0}};
    int round;

    LoadBytes(&s, plain16);
    AddRoundKey(&s, rounds++);

    for (round = 1; round < nrounds; round++) {
        SubBytes(&s, 0);
        ShiftRows(&s);
        MixColumns(&s, 0);
        AddRoundKey(&s, rounds++);
    }

    SubBytes(&s, 0);
    ShiftRows(&s);
    AddRoundKey(&s, rounds);

    SaveBytes(cipher16, &s);
}